

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl.c
# Opt level: O1

void OPL3_RhythmSetupAlg(opl3_chip *chip)

{
  uint uVar1;
  Bit16s *pBVar2;
  
  uVar1 = chip->muteMask;
  if ((uVar1 >> 0x12 & 1) == 0) {
    pBVar2 = &chip->channel[6].slots[1]->out;
  }
  else {
    pBVar2 = &zeromod;
  }
  chip->channel[6].out[0] = pBVar2;
  chip->channel[6].out[1] = pBVar2;
  pBVar2 = &zeromod;
  chip->channel[6].out[2] = &zeromod;
  chip->channel[6].out[3] = &zeromod;
  if ((uVar1 >> 0x16 & 1) == 0) {
    pBVar2 = &chip->channel[7].slots[0]->out;
  }
  chip->channel[7].out[0] = pBVar2;
  chip->channel[7].out[1] = pBVar2;
  if ((uVar1 >> 0x13 & 1) == 0) {
    pBVar2 = &chip->channel[7].slots[1]->out;
  }
  else {
    pBVar2 = &zeromod;
  }
  chip->channel[7].out[2] = pBVar2;
  chip->channel[7].out[3] = pBVar2;
  if ((uVar1 >> 0x14 & 1) == 0) {
    pBVar2 = &chip->channel[8].slots[0]->out;
  }
  else {
    pBVar2 = &zeromod;
  }
  chip->channel[8].out[0] = pBVar2;
  chip->channel[8].out[1] = pBVar2;
  if ((uVar1 >> 0x15 & 1) == 0) {
    pBVar2 = &chip->channel[8].slots[1]->out;
  }
  else {
    pBVar2 = &zeromod;
  }
  chip->channel[8].out[2] = pBVar2;
  chip->channel[8].out[3] = pBVar2;
  return;
}

Assistant:

static void OPL3_RhythmSetupAlg(opl3_chip *chip)
{
    opl3_channel *channel6 = &chip->channel[6];
    opl3_channel *channel7 = &chip->channel[7];
    opl3_channel *channel8 = &chip->channel[8];
    channel6->out[0] = (chip->muteMask & (1 << mch_bd)) ? &zeromod : &channel6->slots[1]->out;
    channel6->out[1] = (chip->muteMask & (1 << mch_bd)) ? &zeromod : &channel6->slots[1]->out;
    channel6->out[2] = &zeromod;
    channel6->out[3] = &zeromod;
    channel7->out[0] = (chip->muteMask & (1 << mch_hh)) ? &zeromod : &channel7->slots[0]->out;
    channel7->out[1] = (chip->muteMask & (1 << mch_hh)) ? &zeromod : &channel7->slots[0]->out;
    channel7->out[2] = (chip->muteMask & (1 << mch_sd)) ? &zeromod : &channel7->slots[1]->out;
    channel7->out[3] = (chip->muteMask & (1 << mch_sd)) ? &zeromod : &channel7->slots[1]->out;
    channel8->out[0] = (chip->muteMask & (1 << mch_tt)) ? &zeromod : &channel8->slots[0]->out;
    channel8->out[1] = (chip->muteMask & (1 << mch_tt)) ? &zeromod : &channel8->slots[0]->out;
    channel8->out[2] = (chip->muteMask & (1 << mch_tc)) ? &zeromod : &channel8->slots[1]->out;
    channel8->out[3] = (chip->muteMask & (1 << mch_tc)) ? &zeromod : &channel8->slots[1]->out;
}